

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O2

int web_server_set_alias
              (char *alias_name,char *alias_content,size_t alias_content_length,time_t last_modified
              )

{
  membuffer *m;
  int iVar1;
  long lVar2;
  xml_alias_t *pxVar3;
  xml_alias_t *pxVar4;
  byte bVar5;
  xml_alias_t alias;
  
  bVar5 = 0;
  alias_release(&gAliasDoc);
  if (alias_name == (char *)0x0) {
    return 0;
  }
  if (alias_content != (char *)0x0) {
    m = &alias.doc;
    membuffer_init(m);
    membuffer_init(&alias.name);
    alias.ct = (int *)0x0;
    if ((((*alias_name == '/') || (iVar1 = membuffer_assign_str(&alias.name,"/"), iVar1 == 0)) &&
        (iVar1 = membuffer_append_str(&alias.name,alias_name), iVar1 == 0)) &&
       (alias.ct = (int *)malloc(4), alias.ct != (int *)0x0)) {
      *alias.ct = 1;
      membuffer_attach(m,alias_content,alias_content_length);
      alias.last_modified = last_modified;
      pthread_mutex_lock((pthread_mutex_t *)&gWebMutex);
      pxVar3 = &alias;
      pxVar4 = &gAliasDoc;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pxVar4->name).buf = (pxVar3->name).buf;
        pxVar3 = (xml_alias_t *)((long)pxVar3 + (ulong)bVar5 * -0x10 + 8);
        pxVar4 = (xml_alias_t *)((long)pxVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&gWebMutex);
      return 0;
    }
    membuffer_destroy(&alias.name);
    membuffer_destroy(m);
    free(alias.ct);
    return -0x68;
  }
  __assert_fail("alias_content != NULL",".upnp/src/genlib/net/http/webserver.c",0x1b5,
                "int web_server_set_alias(const char *, const char *, size_t, time_t)");
}

Assistant:

int web_server_set_alias(const char *alias_name,
	const char *alias_content,
	size_t alias_content_length,
	time_t last_modified)
{
	int ret_code;
	struct xml_alias_t alias;

	alias_release(&gAliasDoc);
	if (alias_name == NULL) {
		/* don't serve aliased doc anymore */
		return 0;
	}
	assert(alias_content != NULL);
	membuffer_init(&alias.doc);
	membuffer_init(&alias.name);
	alias.ct = NULL;
	do {
		/* insert leading /, if missing */
		if (*alias_name != '/')
			if (membuffer_assign_str(&alias.name, "/") != 0)
				break; /* error; out of mem */
		ret_code = membuffer_append_str(&alias.name, alias_name);
		if (ret_code != 0)
			break; /* error */
		if ((alias.ct = (int *)malloc(sizeof(int))) == NULL)
			break; /* error */
		*alias.ct = 1;
		membuffer_attach(&alias.doc,
			(char *)alias_content,
			alias_content_length);
		alias.last_modified = last_modified;
		/* save in module var */
		ithread_mutex_lock(&gWebMutex);
		gAliasDoc = alias;
		ithread_mutex_unlock(&gWebMutex);

		return 0;
	} while (0);
	/* error handler */
	/* free temp alias */
	membuffer_destroy(&alias.name);
	membuffer_destroy(&alias.doc);
	free(alias.ct);

	return UPNP_E_OUTOF_MEMORY;
}